

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O0

int ext_loader_impl_clear(loader_impl impl,loader_handle handle)

{
  long lVar1;
  key_type *pkVar2;
  loader_impl_ext_handle_lib_type *this;
  reference pvVar3;
  vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_> *in_RSI;
  undefined8 in_RDI;
  size_t i;
  loader_impl_ext_handle ext_handle;
  loader_impl_ext ext_impl;
  loader_impl_ext_handle_lib_type *this_00;
  __normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
  *in_stack_ffffffffffffff78;
  vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
  *in_stack_ffffffffffffff80;
  const_iterator __position;
  key_type *__k;
  iterator in_stack_ffffffffffffffb0;
  key_type *local_30;
  int local_4;
  
  lVar1 = loader_impl_get(in_RDI);
  if (lVar1 == 0) {
    local_4 = 1;
  }
  else if (in_RSI == (vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
                      *)0x0) {
    local_4 = 1;
  }
  else {
    local_30 = (key_type *)0x0;
    while( true ) {
      __k = local_30;
      pkVar2 = (key_type *)
               std::
               vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
               ::size(in_RSI);
      if (pkVar2 <= __k) break;
      std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
      ::operator[](in_RSI,(size_type)local_30);
      this = (loader_impl_ext_handle_lib_type *)std::__cxx11::string::c_str();
      pvVar3 = std::
               vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
               ::operator[](in_RSI,(size_type)local_30);
      this_00 = (loader_impl_ext_handle_lib_type *)pvVar3->handle;
      __position._M_current = this;
      log_write_impl_va("metacall",0x14c,"ext_loader_impl_clear",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/ext_loader/source/ext_loader_impl.cpp"
                        ,0,"Storing handle: %s <%p> in destroy list");
      std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
      ::operator[](in_RSI,(size_type)local_30);
      std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
      ::operator[](in_RSI,(size_type)local_30);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_loader_impl_ext_handle_lib_type>_>_>
                    *)in_stack_ffffffffffffffb0._M_current,__k);
      loader_impl_ext_handle_lib_type::operator=(this_00,this);
      std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
      ::begin((vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
               *)this);
      __gnu_cxx::
      __normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
      ::operator+(in_stack_ffffffffffffff78,(difference_type)this_00);
      __gnu_cxx::
      __normal_iterator<loader_impl_ext_handle_lib_type_const*,std::vector<loader_impl_ext_handle_lib_type,std::allocator<loader_impl_ext_handle_lib_type>>>
      ::__normal_iterator<loader_impl_ext_handle_lib_type*>
                ((__normal_iterator<const_loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
                  *)this_00,
                 (__normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
                  *)this);
      in_stack_ffffffffffffffb0 =
           std::
           vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
           ::erase(in_stack_ffffffffffffff80,__position);
      local_30 = (key_type *)&local_30->field_0x1;
    }
    if (in_RSI != (vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
                   *)0x0) {
      loader_impl_ext_handle_type::~loader_impl_ext_handle_type
                ((loader_impl_ext_handle_type *)0x109a68);
      operator_delete(in_RSI,0x18);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ext_loader_impl_clear(loader_impl impl, loader_handle handle)
{
	loader_impl_ext ext_impl = static_cast<loader_impl_ext>(loader_impl_get(impl));

	if (ext_impl == NULL)
	{
		return 1;
	}

	loader_impl_ext_handle ext_handle = static_cast<loader_impl_ext_handle>(handle);

	if (ext_handle != NULL)
	{
		for (size_t i = 0; i < ext_handle->extensions.size(); i++)
		{
			log_write("metacall", LOG_LEVEL_DEBUG, "Storing handle: %s <%p> in destroy list", ext_handle->extensions[i].name.c_str(), ext_handle->extensions[i].handle);
			ext_impl->destroy_list[ext_handle->extensions[i].name] = ext_handle->extensions[i];
			ext_handle->extensions.erase(ext_handle->extensions.begin() + i);
		}

		delete ext_handle;

		return 0;
	}

	return 1;
}